

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O3

PAL_ERROR CorUnix::InternalSetFilePointer
                    (CPalThread *pThread,HANDLE hFile,LONG lDistanceToMove,
                    PLONG lpDistanceToMoveHigh,DWORD dwMoveMethod,PLONG lpNewFilePointerLow)

{
  PAL_ERROR PVar1;
  long local_48;
  CFileProcessLocalData *pLocalData;
  IDataLock *pLocalDataLock;
  IPalObject *pFileObject;
  
  pLocalDataLock = (IDataLock *)0x0;
  local_48 = 0;
  pLocalData = (CFileProcessLocalData *)0x0;
  if (hFile == (HANDLE)0xffffffffffffffff) {
    PVar1 = 6;
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
  }
  else {
    PVar1 = (**(code **)(*g_pObjectManager + 0x28))
                      (g_pObjectManager,pThread,hFile,aotFile,0x80000000,&pLocalDataLock);
    if (PVar1 == 0) {
      PVar1 = (*pLocalDataLock->_vptr_IDataLock[3])(pLocalDataLock,pThread,0,&pLocalData,&local_48);
      if (PVar1 == 0) {
        PVar1 = InternalSetFilePointerForUnixFd
                          (*(int *)(local_48 + 8),lDistanceToMove,lpDistanceToMoveHigh,dwMoveMethod,
                           lpNewFilePointerLow);
      }
    }
    if (pLocalData != (CFileProcessLocalData *)0x0) {
      (*(code *)pLocalData->pLockController->_vptr_IFileLockController)(pLocalData,pThread,0);
    }
  }
  if (pLocalDataLock != (IDataLock *)0x0) {
    (*pLocalDataLock->_vptr_IDataLock[8])(pLocalDataLock,pThread);
  }
  return PVar1;
}

Assistant:

PAL_ERROR
CorUnix::InternalSetFilePointer(
    CPalThread *pThread,
    HANDLE hFile,
    LONG lDistanceToMove,
    PLONG lpDistanceToMoveHigh,
    DWORD dwMoveMethod,
    PLONG lpNewFilePointerLow
    )
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pFileObject = NULL;
    CFileProcessLocalData *pLocalData = NULL;
    IDataLock *pLocalDataLock = NULL;

    if (INVALID_HANDLE_VALUE == hFile)
    {
        ERROR( "Invalid file handle\n" );
        palError = ERROR_INVALID_HANDLE;
        goto InternalSetFilePointerExit;
    }

    palError = g_pObjectManager->ReferenceObjectByHandle(
        pThread,
        hFile,
        &aotFile,
        GENERIC_READ,
        &pFileObject
        );

    if (NO_ERROR != palError)
    {
        goto InternalSetFilePointerExit;
    }

    palError = pFileObject->GetProcessLocalData(
        pThread,
        ReadLock, 
        &pLocalDataLock,
        reinterpret_cast<void**>(&pLocalData)
        );

    if (NO_ERROR != palError)
    {
        goto InternalSetFilePointerExit;
    }

    palError = InternalSetFilePointerForUnixFd(
        pLocalData->unix_fd,
        lDistanceToMove,
        lpDistanceToMoveHigh,
        dwMoveMethod,
        lpNewFilePointerLow
        );
    
InternalSetFilePointerExit:

    if (NULL != pLocalDataLock)
    {
        pLocalDataLock->ReleaseLock(pThread, FALSE);
    }

    if (NULL != pFileObject)
    {
        pFileObject->ReleaseReference(pThread);
    }

    return palError;
}